

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void chrono::Transform_Cq_to_Cqw
               (ChConstraintMatrixX7 *mCq,ChConstraintMatrixX6 *mCqw,ChBodyFrame *mbody)

{
  double dVar1;
  undefined1 auVar2 [16];
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  int row;
  long row_00;
  long lVar6;
  int col;
  long col_00;
  int colres;
  long row_01;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChGlMatrix34<double> mGl;
  ChGlMatrix34<double> local_100;
  Block<Eigen::Matrix<double,__1,_6,_1,_7,_6>,__1,__1,_false> local_90;
  
  Eigen::Block<const_Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_-1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,_7,_1,_7,_7>,__1,__1,_false> *)&local_100,mCq,0,0
             ,(mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.m_rows,
             3);
  Eigen::Block<Eigen::Matrix<double,_-1,_6,_1,_7,_6>,_-1,_-1,_false>::Block
            (&local_90,mCqw,0,0,
             (mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.m_rows,3
            );
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,6,1,7,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>const,_1,_1,false>>
            (&local_90,
             (Block<const_Eigen::Matrix<double,__1,_7,_1,_7,_7>,__1,__1,_false> *)&local_100);
  ChGlMatrix34<double>::ChGlMatrix34
            (&local_100,&(mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  for (row_01 = 0; row_01 != 3; row_01 = row_01 + 1) {
    for (row_00 = 0;
        row_00 < (mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.
                 m_rows; row_00 = row_00 + 1) {
      auVar8 = ZEXT816(0) << 0x40;
      lVar6 = 4;
      col_00 = 0;
      while( true ) {
        bVar7 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if (bVar7) break;
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_0> *)mCq,row_00,
                            col_00 + 3);
        dVar1 = *pdVar3;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1> *)&local_100,
                            row_01,col_00);
        auVar8._8_8_ = 0;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar1;
        col_00 = col_00 + 1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pSVar4;
        auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar2);
      }
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_6,_1,_7,_6>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>,_1> *)mCqw,row_00,
                          row_01 + 3);
      *pSVar5 = auVar8._0_8_ * 0.25;
    }
  }
  return;
}

Assistant:

static void Transform_Cq_to_Cqw(const ChLinkLock::ChConstraintMatrixX7& mCq,
                                ChLinkLock::ChConstraintMatrixX6& mCqw,
                                ChBodyFrame* mbody) {
    // translational part - not changed
    mCqw.block(0, 0, mCq.rows(), 3) = mCq.block(0, 0, mCq.rows(), 3);

    // rotational part [Cq_w] = [Cq_q]*[Gl]'*1/4
    ChGlMatrix34<> mGl(mbody->GetCoord().rot);
    for (int colres = 0; colres < 3; colres++) {
        for (int row = 0; row < mCq.rows(); row++) {
            double sum = 0;
            for (int col = 0; col < 4; col++) {
                sum += mCq(row, col + 3) * mGl(colres, col);
            }
            mCqw(row, colres + 3) = sum * 0.25;
        }
    }
    //// RADU: explicit loop slightly more performant than Eigen expressions
    ////mCqw.block(0, 3, mCq.rows(), 3) = 0.25 * mCq.block(0, 3, mCq.rows(), 4) * mGl.transpose();
}